

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O0

uhugeint_t
duckdb::VectorTryCastOperator<duckdb::NumericTryCast>::
Operation<duckdb::hugeint_t,duckdb::uhugeint_t>
          (hugeint_t input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  undefined8 in_R8;
  VectorTryCastData *data;
  uhugeint_t output;
  undefined1 in_stack_00000140 [16];
  VectorTryCastData *in_stack_ffffffffffffff38;
  string *idx_00;
  ValidityMask *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  hugeint_t in_stack_ffffffffffffff58;
  string local_80 [32];
  undefined8 local_60;
  uint64_t local_48;
  uint64_t local_40;
  undefined8 local_38;
  uhugeint_t local_10;
  
  local_38 = in_R8;
  bVar1 = NumericTryCast::Operation<duckdb::hugeint_t,duckdb::uhugeint_t>
                    (in_stack_ffffffffffffff58,(uhugeint_t *)in_stack_ffffffffffffff50,
                     SUB81((ulong)in_stack_ffffffffffffff48 >> 0x38,0));
  if (bVar1) {
    local_10.upper = local_40;
    local_10.lower = local_48;
  }
  else {
    local_60 = local_38;
    idx_00 = local_80;
    CastExceptionText<duckdb::hugeint_t,duckdb::uhugeint_t>((hugeint_t)in_stack_00000140);
    local_10 = HandleVectorCastError::Operation<duckdb::uhugeint_t>
                         (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(idx_t)idx_00,
                          in_stack_ffffffffffffff38);
    ::std::__cxx11::string::~string(local_80);
  }
  return local_10;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output))) {
			return output;
		}
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}